

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::write_rle85(Fl_PostScript_Graphics_Driver *this,uchar b,void *data)

{
  uchar *p;
  uint uVar1;
  uchar c;
  
  uVar1 = *(uint *)((long)data + 0x8c);
  if (0 < (int)uVar1) {
    if ((uVar1 < 0x80) && (*(uchar *)((long)data + 8) == b)) {
      *(uint *)((long)data + 0x8c) = uVar1 + 1;
      return;
    }
    c = '\x01' - (char)uVar1;
    write85(this,*data,&c,1);
    write85(this,*data,(uchar *)((long)data + 8),1);
    *(undefined4 *)((long)data + 0x8c) = 0;
  }
  uVar1 = *(uint *)((long)data + 0x88);
  if (1 < (int)uVar1) {
    p = (uchar *)((long)data + 8);
    if ((*(uchar *)((long)data + (ulong)(uVar1 - 1) + 8) == b) && (p[uVar1 - 2] == b)) {
      if (uVar1 != 2) {
        c = (char)uVar1 + 0xfd;
        write85(this,*data,&c,1);
        write85(this,*data,p,*(int *)((long)data + 0x88) + -2);
      }
      *(uchar *)((long)data + 8) = b;
      *(undefined8 *)((long)data + 0x88) = 0x300000000;
      return;
    }
    if (0x7f < uVar1) {
      c = (char)uVar1 + 0xff;
      write85(this,*data,&c,1);
      write85(this,*data,p,*(int *)((long)data + 0x88));
      uVar1 = 0;
    }
  }
  *(uint *)((long)data + 0x88) = uVar1 + 1;
  *(uchar *)((long)data + (long)(int)uVar1 + 8) = b;
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::write_rle85(uchar b, void *data) // sends one input byte to RLE+ASCII85 encoding
{
  struct_rle85 *rle = (struct_rle85 *)data;
  uchar c;
  if (rle->run_length > 0) { // if within a run
    if (b == rle->buffer[0] &&  rle->run_length < 128) { // the run can be extended
      rle->run_length++;
      return;
    } else { // output the run
      c = (uchar)(257 - rle->run_length);
      write85(rle->data85, &c, 1); // the run-length info
      write85(rle->data85, rle->buffer, 1); // the byte of the run
      rle->run_length = 0;
    }
  }
  if (rle->count >= 2 && b == rle->buffer[rle->count-1] && b == rle->buffer[rle->count-2]) {
    // about to begin a run
    if (rle->count > 2) { // there is non-run data before the run in the buffer
      c = (uchar)(rle->count-2 - 1);
      write85(rle->data85, &c, 1); // length of non-run data
      write85(rle->data85, rle->buffer, rle->count-2); // non-run data
    }
    rle->run_length = 3;
    rle->buffer[0] = b;
    rle->count = 0;
    return;
  }
  if (rle->count >= 128) { // the non-run buffer is full, output it
    c = (uchar)(rle->count - 1);
    write85(rle->data85, &c, 1); // length of non-run data
    write85(rle->data85, rle->buffer, rle->count); // non-run data
    rle->count = 0;
  }
  rle->buffer[rle->count++] = b; // add byte to end of non-run buffer
}